

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
tf::detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (int *begin,int *end)

{
  int *piVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  int __tmp;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  int *piVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  int *piVar19;
  bool bVar20;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar21;
  uchar offsets_l_storage [128];
  byte abStack_101 [128];
  byte abStack_81 [81];
  
  iVar4 = *begin;
  lVar6 = 0;
  do {
    iVar5 = *(int *)((long)begin + lVar6 + 4);
    lVar6 = lVar6 + 4;
  } while (iVar5 < iVar4);
  piVar1 = (int *)((long)begin + lVar6);
  piVar14 = end;
  if (lVar6 == 4) {
    do {
      if (end <= piVar1) break;
      piVar14 = end + -1;
      piVar12 = end + -1;
      end = piVar14;
    } while (iVar4 <= *piVar12);
  }
  else {
    do {
      end = piVar14 + -1;
      piVar12 = piVar14 + -1;
      piVar14 = end;
    } while (iVar4 <= *piVar12);
  }
  piVar14 = piVar1;
  if (piVar1 < end) {
    piVar16 = (int *)((long)begin + lVar6) + 1;
    *(int *)((long)begin + lVar6) = *end;
    *end = iVar5;
    piVar12 = end;
    piVar14 = piVar16;
    piVar19 = end;
    if (piVar16 < end) {
      lVar15 = 0;
      uVar18 = 0;
      uVar13 = 0;
      lVar6 = 0;
      do {
        uVar17 = (long)piVar12 - (long)piVar14 >> 2;
        uVar9 = uVar17 >> (uVar18 == 0);
        if (uVar13 != 0) {
          uVar9 = 0;
        }
        uVar17 = uVar17 - uVar9;
        if (uVar18 != 0) {
          uVar17 = 0;
        }
        uVar7 = uVar13;
        if (uVar9 < 0x40) {
          if (uVar9 != 0) {
            bVar8 = 0;
            do {
              abStack_81[uVar7 + 1] = bVar8;
              bVar8 = bVar8 + 1;
              uVar7 = uVar7 + (iVar4 <= *piVar14);
              piVar14 = piVar14 + 1;
            } while (bVar8 < (byte)uVar9);
          }
        }
        else {
          bVar8 = 0;
          do {
            abStack_81[uVar7 + 1] = bVar8;
            lVar10 = (iVar4 <= *piVar14) + uVar7;
            abStack_81[lVar10 + 1] = bVar8 + 1;
            lVar10 = (ulong)(iVar4 <= piVar14[1]) + lVar10;
            abStack_81[lVar10 + 1] = bVar8 + 2;
            lVar10 = (ulong)(iVar4 <= piVar14[2]) + lVar10;
            abStack_81[lVar10 + 1] = bVar8 + 3;
            lVar10 = (ulong)(iVar4 <= piVar14[3]) + lVar10;
            abStack_81[lVar10 + 1] = bVar8 + 4;
            lVar10 = (ulong)(iVar4 <= piVar14[4]) + lVar10;
            abStack_81[lVar10 + 1] = bVar8 + 5;
            lVar10 = (ulong)(iVar4 <= piVar14[5]) + lVar10;
            abStack_81[lVar10 + 1] = bVar8 + 6;
            lVar10 = (ulong)(iVar4 <= piVar14[6]) + lVar10;
            abStack_81[lVar10 + 1] = bVar8 + 7;
            uVar7 = (ulong)(iVar4 <= piVar14[7]) + lVar10;
            piVar14 = piVar14 + 8;
            bVar20 = bVar8 < 0x38;
            bVar8 = bVar8 + 8;
          } while (bVar20);
        }
        if (uVar17 < 0x40) {
          if (uVar17 != 0) {
            bVar8 = 0;
            piVar11 = piVar12;
            do {
              bVar8 = bVar8 + 1;
              abStack_101[uVar18 + 1] = bVar8;
              piVar12 = piVar11 + -1;
              uVar18 = uVar18 + (piVar11[-1] < iVar4);
              piVar11 = piVar12;
            } while (bVar8 < (byte)uVar17);
          }
        }
        else {
          bVar8 = 0xf8;
          piVar11 = piVar12;
          do {
            abStack_101[uVar18 + 1] = bVar8 + 9;
            lVar10 = (piVar11[-1] < iVar4) + uVar18;
            abStack_101[lVar10 + 1] = bVar8 + 10;
            lVar10 = (ulong)(piVar11[-2] < iVar4) + lVar10;
            abStack_101[lVar10 + 1] = bVar8 + 0xb;
            lVar10 = (ulong)(piVar11[-3] < iVar4) + lVar10;
            abStack_101[lVar10 + 1] = bVar8 + 0xc;
            lVar10 = (ulong)(piVar11[-4] < iVar4) + lVar10;
            abStack_101[lVar10 + 1] = bVar8 + 0xd;
            lVar10 = (ulong)(piVar11[-5] < iVar4) + lVar10;
            abStack_101[lVar10 + 1] = bVar8 + 0xe;
            lVar10 = (ulong)(piVar11[-6] < iVar4) + lVar10;
            abStack_101[lVar10 + 1] = bVar8 + 0xf;
            lVar10 = (ulong)(piVar11[-7] < iVar4) + lVar10;
            abStack_101[lVar10 + 1] = bVar8 + 0x10;
            piVar12 = piVar11 + -8;
            uVar18 = (ulong)(piVar11[-8] < iVar4) + lVar10;
            bVar8 = bVar8 + 8;
            piVar11 = piVar12;
          } while (bVar8 < 0x38);
        }
        uVar9 = uVar7;
        if (uVar18 < uVar7) {
          uVar9 = uVar18;
        }
        pbVar2 = abStack_81 + lVar6 + 1;
        pbVar3 = abStack_101 + lVar15 + 1;
        if (uVar7 == uVar18) {
          if (uVar9 != 0) {
            uVar13 = 0;
            do {
              bVar8 = pbVar3[uVar13];
              iVar5 = piVar16[pbVar2[uVar13]];
              piVar16[pbVar2[uVar13]] = piVar19[-(ulong)bVar8];
              piVar19[-(ulong)bVar8] = iVar5;
              uVar13 = uVar13 + 1;
            } while (uVar9 != uVar13);
          }
        }
        else if (uVar9 != 0) {
          piVar11 = piVar19 + -(ulong)*pbVar3;
          iVar5 = piVar16[*pbVar2];
          piVar16[*pbVar2] = *piVar11;
          if (uVar9 != 1) {
            uVar13 = 1;
            do {
              bVar8 = pbVar2[uVar13];
              *piVar11 = piVar16[bVar8];
              piVar11 = piVar19 + -(ulong)pbVar3[uVar13];
              piVar16[bVar8] = *piVar11;
              uVar13 = uVar13 + 1;
            } while (uVar9 != uVar13);
          }
          *piVar11 = iVar5;
        }
        uVar13 = uVar7 - uVar9;
        lVar6 = lVar6 + uVar9;
        lVar15 = lVar15 + uVar9;
        if (uVar7 <= uVar18) {
          lVar6 = 0;
          piVar16 = piVar14;
        }
        uVar18 = uVar18 - uVar9;
        if (uVar18 == 0) {
          lVar15 = 0;
          piVar19 = piVar12;
        }
      } while (piVar14 < piVar12);
    }
    else {
      uVar13 = 0;
      uVar18 = 0;
      lVar15 = 0;
      lVar6 = 0;
    }
    for (; uVar13 != 0; uVar13 = uVar13 - 1) {
      piVar14 = piVar12 + -1;
      iVar5 = piVar16[abStack_81[uVar13 + lVar6]];
      piVar16[abStack_81[uVar13 + lVar6]] = piVar12[-1];
      piVar12[-1] = iVar5;
      piVar12 = piVar14;
    }
    for (; uVar18 != 0; uVar18 = uVar18 - 1) {
      iVar5 = piVar19[-(ulong)abStack_101[uVar18 + lVar15]];
      piVar19[-(ulong)abStack_101[uVar18 + lVar15]] = *piVar14;
      *piVar14 = iVar5;
      piVar14 = piVar14 + 1;
    }
  }
  pVar21._9_7_ = (undefined7)((ulong)piVar1 >> 8);
  pVar21.second = end <= piVar1;
  *begin = piVar14[-1];
  piVar14[-1] = iVar4;
  pVar21.first._M_current = piVar14 + -1;
  return pVar21;
}

Assistant:

std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {

  typedef typename std::iterator_traits<Iter>::value_type T;

  constexpr size_t block_size = 64;
  constexpr size_t cacheline_size = 64;

  // Move pivot into local for speed.
  T pivot(std::move(*begin));
  Iter first = begin;
  Iter last = end;

  // Find the first element greater than or equal than the pivot (the median of 3 guarantees
  // this exists).
  while (comp(*++first, pivot));

  // Find the first element strictly smaller than the pivot. We have to guard this search if
  // there was no element before *first.
  if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
  else                    while (                !comp(*--last, pivot));

  // If the first pair of elements that should be swapped to partition are the same element,
  // the passed in sequence already was correctly partitioned.
  bool already_partitioned = first >= last;
  if (!already_partitioned) {
    std::iter_swap(first, last);
    ++first;

    // The following branchless partitioning is derived from "BlockQuicksort: How Branch
    // Mispredictions don't affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
    // heavily micro-optimized.
    unsigned char offsets_l_storage[block_size + cacheline_size];
    unsigned char offsets_r_storage[block_size + cacheline_size];
    unsigned char* offsets_l = align_cacheline(offsets_l_storage);
    unsigned char* offsets_r = align_cacheline(offsets_r_storage);

    Iter offsets_l_base = first;
    Iter offsets_r_base = last;
    size_t num_l, num_r, start_l, start_r;
    num_l = num_r = start_l = start_r = 0;

    while (first < last) {
      // Fill up offset blocks with elements that are on the wrong side.
      // First we determine how much elements are considered for each offset block.
      size_t num_unknown = last - first;
      size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
      size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

      // Fill the offset blocks.
      if (left_split >= block_size) {
        for (unsigned char i = 0; i < block_size;) {
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
        }
      } else {
        for (unsigned char i = 0; i < left_split;) {
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
        }
      }

      if (right_split >= block_size) {
        for (unsigned char i = 0; i < block_size;) {
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
        }
      } else {
        for (unsigned char i = 0; i < right_split;) {
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
        }
      }

      // Swap elements and update block sizes and first/last boundaries.
      size_t num = std::min(num_l, num_r);
      swap_offsets(
        offsets_l_base, offsets_r_base, 
        offsets_l + start_l, offsets_r + start_r,
        num, num_l == num_r
      );
      num_l -= num; num_r -= num;
      start_l += num; start_r += num;

      if (num_l == 0) {
        start_l = 0;
        offsets_l_base = first;
      }

      if (num_r == 0) {
        start_r = 0;
        offsets_r_base = last;
      }
    }

    // We have now fully identified [first, last)'s proper position. Swap the last elements.
    if (num_l) {
      offsets_l += start_l;
      while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
      first = last;
    }
    if (num_r) {
      offsets_r += start_r;
      while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
      last = first;
    }
  }

  // Put the pivot in the right place.
  Iter pivot_pos = first - 1;
  *begin = std::move(*pivot_pos);
  *pivot_pos = std::move(pivot);

  return std::make_pair(pivot_pos, already_partitioned);
}